

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.h
# Opt level: O0

void __thiscall phpconvert::BaseParser::File::~File(File *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  File *this_local;
  
  psVar1 = this->mainTypes;
  if (psVar1 != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    this_00 = psVar1 + psVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    while (psVar1 != this_00) {
      this_00 = this_00 + -1;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set(this_00);
    }
    operator_delete__(&psVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ::~vector(&this->prepTypesMain);
  std::
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ::~vector(&this->prepTypes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->types);
  std::__cxx11::string::~string((string *)&this->content);
  std::__cxx11::string::~string((string *)&this->firstMainTypeFull);
  std::__cxx11::string::~string((string *)&this->mainType);
  std::__cxx11::string::~string((string *)&this->namespaceName);
  std::__cxx11::string::~string((string *)&this->rootPath);
  std::__cxx11::string::~string((string *)&this->fullPath);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~File(){
                delete[] mainTypes;
            }